

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void FTransform2_SSE2(uint8_t *src,uint8_t *ref,int16_t *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  unkuint9 Var64;
  undefined1 auVar65 [11];
  undefined1 auVar66 [13];
  undefined1 auVar67 [15];
  unkuint9 Var68;
  undefined1 auVar69 [11];
  undefined1 auVar70 [15];
  unkuint9 Var71;
  undefined1 auVar72 [11];
  undefined1 auVar73 [13];
  undefined1 auVar74 [15];
  unkuint9 Var75;
  undefined1 auVar76 [11];
  undefined1 auVar77 [15];
  unkuint9 Var78;
  undefined1 auVar79 [11];
  undefined1 auVar80 [15];
  undefined1 auVar81 [11];
  undefined1 auVar82 [15];
  undefined1 auVar83 [11];
  undefined1 auVar84 [15];
  undefined1 auVar85 [11];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined4 uVar102;
  undefined4 uVar105;
  undefined4 uVar108;
  undefined4 uVar111;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  __m128i shuf01h;
  __m128i v32h;
  __m128i v01h;
  __m128i v32l;
  __m128i v01l;
  __m128i shuf23h;
  __m128i shuf23l;
  __m128i shuf01l;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  longlong local_a8 [2];
  longlong local_98 [2];
  longlong local_88 [2];
  longlong local_78 [2];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  undefined1 auVar103 [12];
  undefined1 auVar104 [16];
  undefined1 auVar106 [12];
  undefined1 auVar107 [16];
  undefined1 auVar109 [12];
  undefined1 auVar110 [16];
  undefined1 auVar112 [12];
  undefined1 auVar113 [16];
  
  uVar1 = *(ulong *)src;
  uVar2 = *(ulong *)(src + 0x20);
  uVar3 = *(ulong *)(src + 0x40);
  uVar4 = *(ulong *)(src + 0x60);
  auVar16._8_6_ = 0;
  auVar16._0_8_ = uVar1;
  auVar16[0xe] = (char)(uVar1 >> 0x38);
  auVar24._8_4_ = 0;
  auVar24._0_8_ = uVar1;
  auVar24[0xc] = (char)(uVar1 >> 0x30);
  auVar24._13_2_ = auVar16._13_2_;
  auVar32._8_4_ = 0;
  auVar32._0_8_ = uVar1;
  auVar32._12_3_ = auVar24._12_3_;
  auVar40._8_2_ = 0;
  auVar40._0_8_ = uVar1;
  auVar40[10] = (char)(uVar1 >> 0x28);
  auVar40._11_4_ = auVar32._11_4_;
  auVar48._8_2_ = 0;
  auVar48._0_8_ = uVar1;
  auVar48._10_5_ = auVar40._10_5_;
  auVar56[8] = (char)(uVar1 >> 0x20);
  auVar56._0_8_ = uVar1;
  auVar56._9_6_ = auVar48._9_6_;
  auVar63._7_8_ = 0;
  auVar63._0_7_ = auVar56._8_7_;
  Var64 = CONCAT81(SUB158(auVar63 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar86._9_6_ = 0;
  auVar86._0_9_ = Var64;
  auVar65._1_10_ = SUB1510(auVar86 << 0x30,5);
  auVar65[0] = (char)(uVar1 >> 0x10);
  auVar87._11_4_ = 0;
  auVar87._0_11_ = auVar65;
  auVar66._1_12_ = SUB1512(auVar87 << 0x20,3);
  auVar66[0] = (char)(uVar1 >> 8);
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar2;
  auVar9[0xe] = (char)(uVar2 >> 0x38);
  auVar17._8_4_ = 0;
  auVar17._0_8_ = uVar2;
  auVar17[0xc] = (char)(uVar2 >> 0x30);
  auVar17._13_2_ = auVar9._13_2_;
  auVar25._8_4_ = 0;
  auVar25._0_8_ = uVar2;
  auVar25._12_3_ = auVar17._12_3_;
  auVar33._8_2_ = 0;
  auVar33._0_8_ = uVar2;
  auVar33[10] = (char)(uVar2 >> 0x28);
  auVar33._11_4_ = auVar25._11_4_;
  auVar41._8_2_ = 0;
  auVar41._0_8_ = uVar2;
  auVar41._10_5_ = auVar33._10_5_;
  auVar49[8] = (char)(uVar2 >> 0x20);
  auVar49._0_8_ = uVar2;
  auVar49._9_6_ = auVar41._9_6_;
  auVar67._7_8_ = 0;
  auVar67._0_7_ = auVar49._8_7_;
  Var68 = CONCAT81(SUB158(auVar67 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar88._9_6_ = 0;
  auVar88._0_9_ = Var68;
  auVar69._1_10_ = SUB1510(auVar88 << 0x30,5);
  auVar69[0] = (char)(uVar2 >> 0x10);
  auVar89._11_4_ = 0;
  auVar89._0_11_ = auVar69;
  auVar57[2] = (char)(uVar2 >> 8);
  auVar57._0_2_ = (ushort)uVar2;
  auVar57._3_12_ = SUB1512(auVar89 << 0x20,3);
  auVar10._8_6_ = 0;
  auVar10._0_8_ = uVar3;
  auVar10[0xe] = (char)(uVar3 >> 0x38);
  auVar18._8_4_ = 0;
  auVar18._0_8_ = uVar3;
  auVar18[0xc] = (char)(uVar3 >> 0x30);
  auVar18._13_2_ = auVar10._13_2_;
  auVar26._8_4_ = 0;
  auVar26._0_8_ = uVar3;
  auVar26._12_3_ = auVar18._12_3_;
  auVar34._8_2_ = 0;
  auVar34._0_8_ = uVar3;
  auVar34[10] = (char)(uVar3 >> 0x28);
  auVar34._11_4_ = auVar26._11_4_;
  auVar42._8_2_ = 0;
  auVar42._0_8_ = uVar3;
  auVar42._10_5_ = auVar34._10_5_;
  auVar50[8] = (char)(uVar3 >> 0x20);
  auVar50._0_8_ = uVar3;
  auVar50._9_6_ = auVar42._9_6_;
  auVar70._7_8_ = 0;
  auVar70._0_7_ = auVar50._8_7_;
  Var71 = CONCAT81(SUB158(auVar70 << 0x40,7),(char)(uVar3 >> 0x18));
  auVar90._9_6_ = 0;
  auVar90._0_9_ = Var71;
  auVar72._1_10_ = SUB1510(auVar90 << 0x30,5);
  auVar72[0] = (char)(uVar3 >> 0x10);
  auVar91._11_4_ = 0;
  auVar91._0_11_ = auVar72;
  auVar73._1_12_ = SUB1512(auVar91 << 0x20,3);
  auVar73[0] = (char)(uVar3 >> 8);
  auVar11._8_6_ = 0;
  auVar11._0_8_ = uVar4;
  auVar11[0xe] = (char)(uVar4 >> 0x38);
  auVar19._8_4_ = 0;
  auVar19._0_8_ = uVar4;
  auVar19[0xc] = (char)(uVar4 >> 0x30);
  auVar19._13_2_ = auVar11._13_2_;
  auVar27._8_4_ = 0;
  auVar27._0_8_ = uVar4;
  auVar27._12_3_ = auVar19._12_3_;
  auVar35._8_2_ = 0;
  auVar35._0_8_ = uVar4;
  auVar35[10] = (char)(uVar4 >> 0x28);
  auVar35._11_4_ = auVar27._11_4_;
  auVar43._8_2_ = 0;
  auVar43._0_8_ = uVar4;
  auVar43._10_5_ = auVar35._10_5_;
  auVar51[8] = (char)(uVar4 >> 0x20);
  auVar51._0_8_ = uVar4;
  auVar51._9_6_ = auVar43._9_6_;
  auVar74._7_8_ = 0;
  auVar74._0_7_ = auVar51._8_7_;
  Var75 = CONCAT81(SUB158(auVar74 << 0x40,7),(char)(uVar4 >> 0x18));
  auVar92._9_6_ = 0;
  auVar92._0_9_ = Var75;
  auVar76._1_10_ = SUB1510(auVar92 << 0x30,5);
  auVar76[0] = (char)(uVar4 >> 0x10);
  auVar93._11_4_ = 0;
  auVar93._0_11_ = auVar76;
  auVar58[2] = (char)(uVar4 >> 8);
  auVar58._0_2_ = (ushort)uVar4;
  auVar58._3_12_ = SUB1512(auVar93 << 0x20,3);
  uVar5 = *(ulong *)ref;
  uVar6 = *(ulong *)(ref + 0x20);
  uVar7 = *(ulong *)(ref + 0x40);
  uVar8 = *(ulong *)(ref + 0x60);
  auVar12._8_6_ = 0;
  auVar12._0_8_ = uVar5;
  auVar12[0xe] = (char)(uVar5 >> 0x38);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = uVar5;
  auVar20[0xc] = (char)(uVar5 >> 0x30);
  auVar20._13_2_ = auVar12._13_2_;
  auVar28._8_4_ = 0;
  auVar28._0_8_ = uVar5;
  auVar28._12_3_ = auVar20._12_3_;
  auVar36._8_2_ = 0;
  auVar36._0_8_ = uVar5;
  auVar36[10] = (char)(uVar5 >> 0x28);
  auVar36._11_4_ = auVar28._11_4_;
  auVar44._8_2_ = 0;
  auVar44._0_8_ = uVar5;
  auVar44._10_5_ = auVar36._10_5_;
  auVar52[8] = (char)(uVar5 >> 0x20);
  auVar52._0_8_ = uVar5;
  auVar52._9_6_ = auVar44._9_6_;
  auVar77._7_8_ = 0;
  auVar77._0_7_ = auVar52._8_7_;
  Var78 = CONCAT81(SUB158(auVar77 << 0x40,7),(char)(uVar5 >> 0x18));
  auVar94._9_6_ = 0;
  auVar94._0_9_ = Var78;
  auVar79._1_10_ = SUB1510(auVar94 << 0x30,5);
  auVar79[0] = (char)(uVar5 >> 0x10);
  auVar95._11_4_ = 0;
  auVar95._0_11_ = auVar79;
  auVar59[2] = (char)(uVar5 >> 8);
  auVar59._0_2_ = (ushort)uVar5;
  auVar59._3_12_ = SUB1512(auVar95 << 0x20,3);
  uVar105 = CONCAT22(auVar66._0_2_ - auVar59._2_2_,(ushort)(byte)uVar1 - ((ushort)uVar5 & 0xff));
  auVar106._0_8_ =
       CONCAT26((short)Var64 - (short)Var78,CONCAT24(auVar65._0_2_ - auVar79._0_2_,uVar105));
  auVar106._8_2_ = auVar56._8_2_ - auVar52._8_2_;
  auVar106._10_2_ = auVar40._10_2_ - auVar36._10_2_;
  auVar107._12_2_ = auVar24._12_2_ - auVar20._12_2_;
  auVar107._0_12_ = auVar106;
  auVar107._14_2_ = (auVar16._13_2_ >> 8) - (auVar12._13_2_ >> 8);
  auVar13._8_6_ = 0;
  auVar13._0_8_ = uVar6;
  auVar13[0xe] = (char)(uVar6 >> 0x38);
  auVar21._8_4_ = 0;
  auVar21._0_8_ = uVar6;
  auVar21[0xc] = (char)(uVar6 >> 0x30);
  auVar21._13_2_ = auVar13._13_2_;
  auVar29._8_4_ = 0;
  auVar29._0_8_ = uVar6;
  auVar29._12_3_ = auVar21._12_3_;
  auVar37._8_2_ = 0;
  auVar37._0_8_ = uVar6;
  auVar37[10] = (char)(uVar6 >> 0x28);
  auVar37._11_4_ = auVar29._11_4_;
  auVar45._8_2_ = 0;
  auVar45._0_8_ = uVar6;
  auVar45._10_5_ = auVar37._10_5_;
  auVar53[8] = (char)(uVar6 >> 0x20);
  auVar53._0_8_ = uVar6;
  auVar53._9_6_ = auVar45._9_6_;
  auVar80._7_8_ = 0;
  auVar80._0_7_ = auVar53._8_7_;
  Var64 = CONCAT81(SUB158(auVar80 << 0x40,7),(char)(uVar6 >> 0x18));
  auVar96._9_6_ = 0;
  auVar96._0_9_ = Var64;
  auVar81._1_10_ = SUB1510(auVar96 << 0x30,5);
  auVar81[0] = (char)(uVar6 >> 0x10);
  auVar97._11_4_ = 0;
  auVar97._0_11_ = auVar81;
  auVar60[2] = (char)(uVar6 >> 8);
  auVar60._0_2_ = (ushort)uVar6;
  auVar60._3_12_ = SUB1512(auVar97 << 0x20,3);
  uVar111 = CONCAT22(auVar57._2_2_ - auVar60._2_2_,((ushort)uVar2 & 0xff) - ((ushort)uVar6 & 0xff));
  auVar112._0_8_ =
       CONCAT26((short)Var68 - (short)Var64,CONCAT24(auVar69._0_2_ - auVar81._0_2_,uVar111));
  auVar112._8_2_ = auVar49._8_2_ - auVar53._8_2_;
  auVar112._10_2_ = auVar33._10_2_ - auVar37._10_2_;
  auVar113._12_2_ = auVar17._12_2_ - auVar21._12_2_;
  auVar113._0_12_ = auVar112;
  auVar113._14_2_ = (auVar9._13_2_ >> 8) - (auVar13._13_2_ >> 8);
  auVar14._8_6_ = 0;
  auVar14._0_8_ = uVar7;
  auVar14[0xe] = (char)(uVar7 >> 0x38);
  auVar22._8_4_ = 0;
  auVar22._0_8_ = uVar7;
  auVar22[0xc] = (char)(uVar7 >> 0x30);
  auVar22._13_2_ = auVar14._13_2_;
  auVar30._8_4_ = 0;
  auVar30._0_8_ = uVar7;
  auVar30._12_3_ = auVar22._12_3_;
  auVar38._8_2_ = 0;
  auVar38._0_8_ = uVar7;
  auVar38[10] = (char)(uVar7 >> 0x28);
  auVar38._11_4_ = auVar30._11_4_;
  auVar46._8_2_ = 0;
  auVar46._0_8_ = uVar7;
  auVar46._10_5_ = auVar38._10_5_;
  auVar54[8] = (char)(uVar7 >> 0x20);
  auVar54._0_8_ = uVar7;
  auVar54._9_6_ = auVar46._9_6_;
  auVar82._7_8_ = 0;
  auVar82._0_7_ = auVar54._8_7_;
  Var64 = CONCAT81(SUB158(auVar82 << 0x40,7),(char)(uVar7 >> 0x18));
  auVar98._9_6_ = 0;
  auVar98._0_9_ = Var64;
  auVar83._1_10_ = SUB1510(auVar98 << 0x30,5);
  auVar83[0] = (char)(uVar7 >> 0x10);
  auVar99._11_4_ = 0;
  auVar99._0_11_ = auVar83;
  auVar61[2] = (char)(uVar7 >> 8);
  auVar61._0_2_ = (ushort)uVar7;
  auVar61._3_12_ = SUB1512(auVar99 << 0x20,3);
  uVar102 = CONCAT22(auVar73._0_2_ - auVar61._2_2_,(ushort)(byte)uVar3 - ((ushort)uVar7 & 0xff));
  auVar103._0_8_ =
       CONCAT26((short)Var71 - (short)Var64,CONCAT24(auVar72._0_2_ - auVar83._0_2_,uVar102));
  auVar103._8_2_ = auVar50._8_2_ - auVar54._8_2_;
  auVar103._10_2_ = auVar34._10_2_ - auVar38._10_2_;
  auVar104._12_2_ = auVar18._12_2_ - auVar22._12_2_;
  auVar104._0_12_ = auVar103;
  auVar104._14_2_ = (auVar10._13_2_ >> 8) - (auVar14._13_2_ >> 8);
  auVar15._8_6_ = 0;
  auVar15._0_8_ = uVar8;
  auVar15[0xe] = (char)(uVar8 >> 0x38);
  auVar23._8_4_ = 0;
  auVar23._0_8_ = uVar8;
  auVar23[0xc] = (char)(uVar8 >> 0x30);
  auVar23._13_2_ = auVar15._13_2_;
  auVar31._8_4_ = 0;
  auVar31._0_8_ = uVar8;
  auVar31._12_3_ = auVar23._12_3_;
  auVar39._8_2_ = 0;
  auVar39._0_8_ = uVar8;
  auVar39[10] = (char)(uVar8 >> 0x28);
  auVar39._11_4_ = auVar31._11_4_;
  auVar47._8_2_ = 0;
  auVar47._0_8_ = uVar8;
  auVar47._10_5_ = auVar39._10_5_;
  auVar55[8] = (char)(uVar8 >> 0x20);
  auVar55._0_8_ = uVar8;
  auVar55._9_6_ = auVar47._9_6_;
  auVar84._7_8_ = 0;
  auVar84._0_7_ = auVar55._8_7_;
  Var64 = CONCAT81(SUB158(auVar84 << 0x40,7),(char)(uVar8 >> 0x18));
  auVar100._9_6_ = 0;
  auVar100._0_9_ = Var64;
  auVar85._1_10_ = SUB1510(auVar100 << 0x30,5);
  auVar85[0] = (char)(uVar8 >> 0x10);
  auVar101._11_4_ = 0;
  auVar101._0_11_ = auVar85;
  auVar62[2] = (char)(uVar8 >> 8);
  auVar62._0_2_ = (ushort)uVar8;
  auVar62._3_12_ = SUB1512(auVar101 << 0x20,3);
  uVar108 = CONCAT22(auVar58._2_2_ - auVar62._2_2_,((ushort)uVar4 & 0xff) - ((ushort)uVar8 & 0xff));
  auVar109._0_8_ =
       CONCAT26((short)Var75 - (short)Var64,CONCAT24(auVar76._0_2_ - auVar85._0_2_,uVar108));
  auVar109._8_2_ = auVar51._8_2_ - auVar55._8_2_;
  auVar109._10_2_ = auVar35._10_2_ - auVar39._10_2_;
  auVar110._12_2_ = auVar19._12_2_ - auVar23._12_2_;
  auVar110._0_12_ = auVar109;
  auVar110._14_2_ = (auVar11._13_2_ >> 8) - (auVar15._13_2_ >> 8);
  auVar114._8_4_ = (int)((ulong)auVar106._0_8_ >> 0x20);
  auVar114._0_8_ = auVar106._0_8_;
  auVar114._12_4_ = (int)((ulong)auVar112._0_8_ >> 0x20);
  lStack_40 = auVar114._8_8_;
  local_48 = CONCAT44(uVar111,uVar105);
  auVar115._8_4_ = (int)((ulong)auVar103._0_8_ >> 0x20);
  auVar115._0_8_ = auVar103._0_8_;
  auVar115._12_4_ = (int)((ulong)auVar109._0_8_ >> 0x20);
  lStack_50 = auVar115._8_8_;
  local_58 = CONCAT44(uVar108,uVar102);
  local_b8 = auVar106._8_4_;
  uStack_b4 = auVar112._8_4_;
  uStack_b0 = auVar107._12_4_;
  uStack_ac = auVar113._12_4_;
  local_68 = auVar103._8_4_;
  uStack_64 = auVar109._8_4_;
  uStack_60 = auVar104._12_4_;
  uStack_5c = auVar110._12_4_;
  FTransformPass1_SSE2((__m128i *)&local_48,(__m128i *)&local_58,&local_78,&local_88);
  FTransformPass1_SSE2((__m128i *)&local_b8,(__m128i *)&local_68,&local_98,&local_a8);
  FTransformPass2_SSE2(&local_78,&local_88,out);
  FTransformPass2_SSE2(&local_98,&local_a8,out + 0x10);
  return;
}

Assistant:

static void FTransform2_SSE2(const uint8_t* src, const uint8_t* ref,
                             int16_t* out) {
  const __m128i zero = _mm_setzero_si128();

  // Load src and convert to 16b.
  const __m128i src0 = _mm_loadl_epi64((const __m128i*)&src[0 * BPS]);
  const __m128i src1 = _mm_loadl_epi64((const __m128i*)&src[1 * BPS]);
  const __m128i src2 = _mm_loadl_epi64((const __m128i*)&src[2 * BPS]);
  const __m128i src3 = _mm_loadl_epi64((const __m128i*)&src[3 * BPS]);
  const __m128i src_0 = _mm_unpacklo_epi8(src0, zero);
  const __m128i src_1 = _mm_unpacklo_epi8(src1, zero);
  const __m128i src_2 = _mm_unpacklo_epi8(src2, zero);
  const __m128i src_3 = _mm_unpacklo_epi8(src3, zero);
  // Load ref and convert to 16b.
  const __m128i ref0 = _mm_loadl_epi64((const __m128i*)&ref[0 * BPS]);
  const __m128i ref1 = _mm_loadl_epi64((const __m128i*)&ref[1 * BPS]);
  const __m128i ref2 = _mm_loadl_epi64((const __m128i*)&ref[2 * BPS]);
  const __m128i ref3 = _mm_loadl_epi64((const __m128i*)&ref[3 * BPS]);
  const __m128i ref_0 = _mm_unpacklo_epi8(ref0, zero);
  const __m128i ref_1 = _mm_unpacklo_epi8(ref1, zero);
  const __m128i ref_2 = _mm_unpacklo_epi8(ref2, zero);
  const __m128i ref_3 = _mm_unpacklo_epi8(ref3, zero);
  // Compute difference. -> 00 01 02 03  00' 01' 02' 03'
  const __m128i diff0 = _mm_sub_epi16(src_0, ref_0);
  const __m128i diff1 = _mm_sub_epi16(src_1, ref_1);
  const __m128i diff2 = _mm_sub_epi16(src_2, ref_2);
  const __m128i diff3 = _mm_sub_epi16(src_3, ref_3);

  // Unpack and shuffle
  // 00 01 02 03   0 0 0 0
  // 10 11 12 13   0 0 0 0
  // 20 21 22 23   0 0 0 0
  // 30 31 32 33   0 0 0 0
  const __m128i shuf01l = _mm_unpacklo_epi32(diff0, diff1);
  const __m128i shuf23l = _mm_unpacklo_epi32(diff2, diff3);
  const __m128i shuf01h = _mm_unpackhi_epi32(diff0, diff1);
  const __m128i shuf23h = _mm_unpackhi_epi32(diff2, diff3);
  __m128i v01l, v32l;
  __m128i v01h, v32h;

  // First pass
  FTransformPass1_SSE2(&shuf01l, &shuf23l, &v01l, &v32l);
  FTransformPass1_SSE2(&shuf01h, &shuf23h, &v01h, &v32h);

  // Second pass
  FTransformPass2_SSE2(&v01l, &v32l, out + 0);
  FTransformPass2_SSE2(&v01h, &v32h, out + 16);
}